

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgn_scanner.c
# Opt level: O2

void * yyrealloc(void *ptr,yy_size_t size)

{
  void *pvVar1;
  
  pvVar1 = realloc(ptr,size);
  return pvVar1;
}

Assistant:

void *yyrealloc  (void * ptr, yy_size_t  size )
{
		
	/* The cast to (char *) in the following accommodates both
	 * implementations that use char* generic pointers, and those
	 * that use void* generic pointers.  It works with the latter
	 * because both ANSI C and C++ allow castless assignment from
	 * any pointer type to void*, and deal with argument conversions
	 * as though doing an assignment.
	 */
	return realloc(ptr, size);
}